

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
SimpleDictionaryTypeHandlerBase
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          ScriptContext *scriptContext,SimplePropertyDescriptor *propertyDescriptors,
          int propertyCount,int slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared,bool isInitialized)

{
  DWORD *propertyKey;
  undefined8 uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  byte bVar5;
  Type *addr;
  long lVar6;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  bVar5 = 0x18;
  if (!isShared) {
    bVar5 = 0;
  }
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,slotCapacity,inlineSlotCapacity,offsetOfInlineSlots,
             (bVar5 | isLocked << 2) + 1);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01554810
  ;
  (this->propertyMap).ptr =
       (BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
        *)0x0;
  (this->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  this->field_0x28 = (this->field_0x28 & 0xf8) + 1;
  this->numDeletedProperties = '\0';
  this->nextPropertyIndex = 0;
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  if (0x3fffffff < slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x121,"(slotCapacity <= MaxPropertyIndexSize)",
                                "slotCapacity <= MaxPropertyIndexSize");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  addr = &this->propertyMap;
  local_78 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ef1b8b;
  data.filename._0_4_ = 0x122;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
  this_00 = (BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,alloc,0x38bbb2);
  JsUtil::
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,scriptContext->recycler,propertyCount);
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  if (0 < propertyCount) {
    lVar6 = 0;
    propertyKey = &data.line;
    do {
      uVar1 = *(undefined8 *)((long)&(propertyDescriptors->Id).ptr + lVar6);
      Memory::Recycler::WBSetBit((char *)propertyKey);
      data._32_8_ = uVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(propertyKey);
      SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
      Add<Memory::WriteBarrierPtr<Js::PropertyRecord_const>>
                ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                 (WriteBarrierPtr<const_Js::PropertyRecord> *)propertyKey,
                 *(PropertyAttributes *)((long)&propertyDescriptors->field_1 + lVar6),isInitialized,
                 false,false,scriptContext);
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(uint)propertyCount << 4 != lVar6);
  }
  return;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SimpleDictionaryTypeHandlerBase(ScriptContext * scriptContext, SimplePropertyDescriptor const* propertyDescriptors, int propertyCount, int slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, bool isInitialized) :
        // Do not RoundUp passed in slotCapacity. This may be called by ConvertTypeHandler for an existing DynamicObject and should use the real existing slotCapacity.
        DynamicTypeHandler(slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | (isLocked ? IsLockedFlag : 0) | (isShared ? (MayBecomeSharedFlag | IsSharedFlag) : 0)),
        nextPropertyIndex(0),
        singletonInstance(nullptr),
        _gc_tag(true),
        isUnordered(false),
        hasNamelessPropertyId(false),
        numDeletedProperties(0)
    {
        SetIsInlineSlotCapacityLocked();
        Assert(slotCapacity <= MaxPropertyIndexSize);
        propertyMap = RecyclerNew(scriptContext->GetRecycler(), SimplePropertyDescriptorMap, scriptContext->GetRecycler(), propertyCount);

        for (int i=0; i < propertyCount; i++)
        {
            Add(propertyDescriptors[i].Id, propertyDescriptors[i].Attributes, isInitialized, false, false, scriptContext);
        }
    }